

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbezier.cpp
# Opt level: O2

void __thiscall
QBezier::addToPolygon(QBezier *this,QPolygonF *polygon,qreal bezier_flattening_threshold)

{
  double dVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  ulong uVar4;
  int iVar5;
  QBezier *this_00;
  long in_FS_OFFSET;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  int levels [10];
  QPointF local_368;
  double local_358;
  double dStack_350;
  double local_348;
  double dStack_340;
  double local_338;
  double dStack_330;
  qreal local_328;
  double dStack_320;
  double local_318;
  double dStack_310;
  double local_308;
  double dStack_300;
  double local_2f8;
  double dStack_2f0;
  undefined8 local_2e8;
  undefined1 *puStack_2e0;
  undefined1 *local_2d8;
  undefined1 *puStack_2d0;
  undefined1 *local_2c8;
  QBezier local_2b8;
  double local_278 [72];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_2c8 = &DAT_aaaaaaaaaaaaaaaa;
  local_2d8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_2d0 = &DAT_aaaaaaaaaaaaaaaa;
  local_2e8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_2e0 = &DAT_aaaaaaaaaaaaaaaa;
  memset(local_278,0xff,0x240);
  local_2b8.x1 = this->x1;
  local_2b8.y1 = this->y1;
  local_2b8.x2 = this->x2;
  local_2b8.y2 = this->y2;
  local_2b8.x3 = this->x3;
  local_2b8.y3 = this->y3;
  local_2b8.x4 = this->x4;
  local_2b8.y4 = this->y4;
  local_2e8 = (undefined1 *)CONCAT44(local_2e8._4_4_,9);
  uVar3 = 0;
  while( true ) {
    if ((int)uVar3 < 0) break;
    uVar4 = (ulong)uVar3;
    this_00 = &local_2b8 + uVar4;
    dVar1 = this_00->x1;
    dVar9 = local_278[uVar4 * 8 + -7];
    dVar11 = local_278[uVar4 * 8 + -2] - dVar1;
    dVar12 = local_278[uVar4 * 8 + -1] - dVar9;
    dVar13 = -dVar12;
    uVar6 = -(ulong)(dVar11 < -dVar11);
    uVar7 = (ulong)dVar13 & -(ulong)(dVar12 < dVar13);
    auVar10._0_8_ = ~uVar6 & (ulong)dVar11;
    auVar10._8_8_ = ~-(ulong)(dVar12 < dVar13) & (ulong)dVar12;
    auVar2._8_4_ = (int)uVar7;
    auVar2._0_8_ = (ulong)-dVar11 & uVar6;
    auVar2._12_4_ = (int)(uVar7 >> 0x20);
    dVar12 = SUB168(auVar10 | auVar2,8) + SUB168(auVar10 | auVar2,0);
    if (dVar12 <= 1.0) {
      dVar12 = dVar1 - local_278[uVar4 * 8 + -6];
      dVar11 = dVar9 - local_278[uVar4 * 8 + -5];
      uVar7 = -(ulong)(dVar12 < -dVar12);
      uVar8 = -(ulong)(dVar11 < -dVar11);
      dVar1 = dVar1 - local_278[uVar4 * 8 + -4];
      uVar6 = -(ulong)(dVar1 < -dVar1);
      dVar14 = (double)(~uVar6 & (ulong)dVar1 | (ulong)-dVar1 & uVar6) +
               (double)(~uVar8 & (ulong)dVar11 | (ulong)-dVar11 & uVar8) +
               (double)(~uVar7 & (ulong)dVar12 | (ulong)-dVar12 & uVar7);
      dVar9 = dVar9 - local_278[uVar4 * 8 + -3];
      dVar12 = 1.0;
    }
    else {
      dVar14 = (dVar9 - local_278[uVar4 * 8 + -5]) * dVar11 +
               (dVar1 - local_278[uVar4 * 8 + -6]) * dVar13;
      uVar7 = -(ulong)(dVar14 < -dVar14);
      dVar14 = (double)(~uVar7 & (ulong)dVar14 | (ulong)-dVar14 & uVar7);
      dVar9 = (dVar9 - local_278[uVar4 * 8 + -3]) * dVar11 +
              (dVar1 - local_278[uVar4 * 8 + -4]) * dVar13;
    }
    uVar7 = -(ulong)(dVar9 < -dVar9);
    if (((double)(~uVar7 & (ulong)dVar9 | (ulong)-dVar9 & uVar7) + dVar14 <
         dVar12 * bezier_flattening_threshold) ||
       (iVar5 = *(int *)((long)&local_2e8 + uVar4 * 4), iVar5 == 0)) {
      local_368.xp = local_278[uVar4 * 8 + -2];
      local_368.yp = local_278[uVar4 * 8 + -1];
      QList<QPointF>::emplaceBack<QPointF>(&polygon->super_QList<QPointF>,&local_368);
      uVar3 = uVar3 - 1;
    }
    else {
      split(this_00);
      local_278[uVar4 * 8 + 6] = local_338;
      local_278[uVar4 * 8 + 7] = dStack_330;
      local_278[uVar4 * 8 + 4] = local_348;
      local_278[uVar4 * 8 + 5] = dStack_340;
      local_278[uVar4 * 8 + 2] = local_358;
      local_278[uVar4 * 8 + 3] = dStack_350;
      local_278[uVar4 * 8] = local_368.xp;
      local_278[uVar4 * 8 + 1] = local_368.yp;
      this_00->x1 = local_328;
      local_278[uVar4 * 8 + -7] = dStack_320;
      local_278[uVar4 * 8 + -6] = local_318;
      local_278[uVar4 * 8 + -5] = dStack_310;
      local_278[uVar4 * 8 + -4] = local_308;
      local_278[uVar4 * 8 + -3] = dStack_300;
      local_278[uVar4 * 8 + -2] = local_2f8;
      local_278[uVar4 * 8 + -1] = dStack_2f0;
      iVar5 = iVar5 + -1;
      *(int *)((long)&local_2e8 + uVar4 * 4) = iVar5;
      uVar3 = uVar3 + 1;
      *(int *)((long)&local_2e8 + uVar4 * 4 + 4) = iVar5;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QBezier::addToPolygon(QPolygonF *polygon, qreal bezier_flattening_threshold) const
{
    QBezier beziers[10];
    int levels[10];
    beziers[0] = *this;
    levels[0] = 9;
    int top = 0;

    while (top >= 0) {
        QBezier *b = &beziers[top];
        // check if we can pop the top bezier curve from the stack
        qreal y4y1 = b->y4 - b->y1;
        qreal x4x1 = b->x4 - b->x1;
        qreal l = qAbs(x4x1) + qAbs(y4y1);
        qreal d;
        if (l > 1.) {
            d = qAbs( (x4x1)*(b->y1 - b->y2) - (y4y1)*(b->x1 - b->x2) )
                + qAbs( (x4x1)*(b->y1 - b->y3) - (y4y1)*(b->x1 - b->x3) );
        } else {
            d = qAbs(b->x1 - b->x2) + qAbs(b->y1 - b->y2) +
                qAbs(b->x1 - b->x3) + qAbs(b->y1 - b->y3);
            l = 1.;
        }
        if (d < bezier_flattening_threshold * l || levels[top] == 0) {
            // good enough, we pop it off and add the endpoint
            polygon->append(QPointF(b->x4, b->y4));
            --top;
        } else {
            // split, second half of the polygon goes lower into the stack
            std::tie(b[1], b[0]) = b->split();
            levels[top + 1] = --levels[top];
            ++top;
        }
    }
}